

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

int __thiscall QHttpNetworkConnectionChannel::close(QHttpNetworkConnectionChannel *this,int __fd)

{
  SocketState SVar1;
  
  if (*(int *)(this + 0x20) != 0x10) {
    if (*(long *)(this + 0x10) == 0) {
      *(undefined4 *)(this + 0x20) = 0;
    }
    else {
      SVar1 = QSocketAbstraction::socketState((QIODevice *)this);
      if (SVar1 == UnconnectedState) {
        *(undefined4 *)(this + 0x20) = 0;
      }
      else {
        *(undefined4 *)(this + 0x20) = 0x10;
      }
    }
    this[0x58] = (QHttpNetworkConnectionChannel)0x0;
    if (*(long *)(this + 0x10) != 0) {
      this = (QHttpNetworkConnectionChannel *)(**(code **)(**(long **)(this + 0x10) + 0x70))();
    }
  }
  return (int)this;
}

Assistant:

void QHttpNetworkConnectionChannel::close()
{
    if (state == QHttpNetworkConnectionChannel::ClosingState)
        return;

    if (!socket)
        state = QHttpNetworkConnectionChannel::IdleState;
    else if (QSocketAbstraction::socketState(socket) == QAbstractSocket::UnconnectedState)
        state = QHttpNetworkConnectionChannel::IdleState;
    else
        state = QHttpNetworkConnectionChannel::ClosingState;

    // pendingEncrypt must only be true in between connected and encrypted states
    pendingEncrypt = false;

    if (socket) {
        // socket can be 0 since the host lookup is done from qhttpnetworkconnection.cpp while
        // there is no socket yet.
        socket->close();
    }
}